

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONIterators.cpp
# Opt level: O2

json_iterator __thiscall JSONNode::find_nocase(JSONNode *this,json_string *name_t)

{
  internalJSONNode *piVar1;
  json_string *in_RDX;
  
  makeUniqueInternal((JSONNode *)name_t);
  piVar1 = (internalJSONNode *)
           internalJSONNode::at_nocase((internalJSONNode *)(name_t->_M_dataplus)._M_p,in_RDX);
  if (piVar1 == (internalJSONNode *)0x0) {
    end(this);
  }
  else {
    this->internal = piVar1;
  }
  return (json_iterator)(JSONNode **)this;
}

Assistant:

JSONNode::json_iterator JSONNode::find_nocase(const json_string & name_t) json_nothrow {
	   JSON_CHECK_INTERNAL();
	   JSON_ASSERT(type() == JSON_NODE, json_global(ERROR_NON_ITERATABLE) + JSON_TEXT("find_nocase"));
	   makeUniqueInternal();
	   if (JSONNode ** res = internal -> at_nocase(name_t)){
		  return ptr_to_json_iterator(res);
	   }
	   return end();
    }